

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O3

int save_data(http_t *info,char *buf,int len)

{
  FILE *pFVar1;
  size_t sVar2;
  int *piVar3;
  int iVar4;
  
  if (info->save_file == (FILE *)0x0) {
    pFVar1 = fopen(info->save_path,"w");
    info->save_file = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      printf("[%s][%s(%d)]:fopen %s error: %m\n","MSG_ERROR","save_data",0x132,info->save_path);
      return -1;
    }
  }
  if (len != 0) {
    iVar4 = len;
    do {
      sVar2 = fwrite(buf,1,(long)len,(FILE *)info->save_file);
      if (((int)sVar2 < len) && (piVar3 = __errno_location(), *piVar3 != 4)) {
        printf("[%s][%s(%d)]:fwrite error: %m\n","MSG_ERROR","save_data",0x13a);
        return -1;
      }
      iVar4 = iVar4 - (int)sVar2;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

int save_data(http_t *info, const char *buf, int len) {
  int total_len = len;
  int write_len = 0;

  // open file
  if (!info->save_file) {
    info->save_file = fopen(info->save_path, "w");
    if (!info->save_file) {
      lprintf(MSG_ERROR, "fopen %s error: %m\n", info->save_path);
      return -1;
    }
  }

  while (total_len) {
    write_len = fwrite(buf, sizeof(char), len, info->save_file);
    if (write_len < len && errno != EINTR) {
      lprintf(MSG_ERROR, "fwrite error: %m\n");
      return -1;
    }
    total_len -= write_len;
  }
  return 0;
}